

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsa_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  int iVar1;
  PaUint32 PVar2;
  PaUtilAllocationGroup *pPVar3;
  int local_54;
  void *pvStack_50;
  int deviceCount;
  void *scanResults;
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaError result;
  PaHostApiIndex hostApiIndex_local;
  PaUtilHostApiRepresentation **hostApi_local;
  
  alsaHostApi._0_4_ = 0;
  scanResults = (void *)0x0;
  pvStack_50 = (void *)0x0;
  local_54 = 0;
  alsaHostApi._4_4_ = hostApiIndex;
  _result = hostApi;
  iVar1 = PaAlsa_LoadLibrary();
  if (iVar1 == 0) {
    hostApi_local._4_4_ = -0x26fb;
  }
  else {
    scanResults = PaUtil_AllocateMemory(0x130);
    if (scanResults == (void *)0x0) {
      PaUtil_DebugPrint(
                       "Expression \'alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory( sizeof(PaAlsaHostApiRepresentation) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 769\n"
                       );
      alsaHostApi._0_4_ = -0x2708;
    }
    else {
      pPVar3 = PaUtil_CreateAllocationGroup();
      *(PaUtilAllocationGroup **)((long)scanResults + 0x120) = pPVar3;
      if (pPVar3 == (PaUtilAllocationGroup *)0x0) {
        PaUtil_DebugPrint(
                         "Expression \'alsaHostApi->allocations = PaUtil_CreateAllocationGroup()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 770\n"
                         );
        alsaHostApi._0_4_ = -0x2708;
      }
      else {
        *(PaHostApiIndex *)((long)scanResults + 0x128) = alsaHostApi._4_4_;
        PVar2 = PaAlsaVersionNum();
        *(PaUint32 *)((long)scanResults + 300) = PVar2;
        *_result = (PaUtilHostApiRepresentation *)scanResults;
        (*_result)->deviceInfos = (PaDeviceInfo **)0x0;
        ((*_result)->info).structVersion = 1;
        ((*_result)->info).type = paALSA;
        ((*_result)->info).name = "ALSA";
        (*_result)->Terminate = Terminate;
        (*_result)->OpenStream = OpenStream;
        (*_result)->IsFormatSupported = IsFormatSupported;
        (*_result)->ScanDeviceInfos = ScanDeviceInfos;
        (*_result)->CommitDeviceInfos = CommitDeviceInfos;
        (*_result)->DisposeDeviceInfos = DisposeDeviceInfos;
        ScanDeviceInfos((PaUtilHostApiRepresentation *)scanResults,alsaHostApi._4_4_,
                        &stack0xffffffffffffffb0,&local_54);
        CommitDeviceInfos((PaUtilHostApiRepresentation *)scanResults,alsaHostApi._4_4_,pvStack_50,
                          local_54);
        PaUtil_InitializeStreamInterface
                  ((PaUtilStreamInterface *)((long)scanResults + 0x60),CloseStream,StartStream,
                   StopStream,AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,
                   GetStreamCpuLoad,PaUtil_DummyRead,PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,
                   PaUtil_DummyGetWriteAvailable);
        PaUtil_InitializeStreamInterface
                  ((PaUtilStreamInterface *)((long)scanResults + 0xc0),CloseStream,StartStream,
                   StopStream,AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,
                   PaUtil_DummyGetCpuLoad,ReadStream,WriteStream,GetStreamReadAvailable,
                   GetStreamWriteAvailable);
        paUtilErr_ = PaUnixThreading_Initialize();
        if (-1 < paUtilErr_) {
          return (PaError)alsaHostApi;
        }
        PaUtil_DebugPrint(
                         "Expression \'PaUnixThreading_Initialize()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 814\n"
                         );
        alsaHostApi._0_4_ = paUtilErr_;
      }
    }
    if (scanResults != (void *)0x0) {
      if (*(long *)((long)scanResults + 0x120) != 0) {
        PaUtil_FreeAllAllocations(*(PaUtilAllocationGroup **)((long)scanResults + 0x120));
        PaUtil_DestroyAllocationGroup(*(PaUtilAllocationGroup **)((long)scanResults + 0x120));
      }
      PaUtil_FreeMemory(scanResults);
    }
    hostApi_local._4_4_ = (PaError)alsaHostApi;
  }
  return hostApi_local._4_4_;
}

Assistant:

PaError PaAlsa_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = NULL;
    void* scanResults = NULL;
    int deviceCount = 0;

    /* Try loading Alsa library. */
    if (!PaAlsa_LoadLibrary())
        return paHostApiNotFound;

    PA_UNLESS( alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory(
                sizeof(PaAlsaHostApiRepresentation) ), paInsufficientMemory );
    PA_UNLESS( alsaHostApi->allocations = PaUtil_CreateAllocationGroup(), paInsufficientMemory );
    alsaHostApi->hostApiIndex = hostApiIndex;
    alsaHostApi->alsaLibVersion = PaAlsaVersionNum();

    *hostApi = (PaUtilHostApiRepresentation*)alsaHostApi;
    (*hostApi)->deviceInfos = NULL;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paALSA;
    (*hostApi)->info.name = "ALSA";

    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;
    (*hostApi)->ScanDeviceInfos = ScanDeviceInfos;
    (*hostApi)->CommitDeviceInfos = CommitDeviceInfos;
    (*hostApi)->DisposeDeviceInfos = DisposeDeviceInfos;

    /** If AlsaErrorHandler is to be used, do not forget to unregister callback pointer in
        Terminate function.
    */
    /*ENSURE_( snd_lib_error_set_handler(AlsaErrorHandler), paUnanticipatedHostError );*/

    ScanDeviceInfos(&alsaHostApi->baseHostApiRep, hostApiIndex, &scanResults,
              &deviceCount);
    CommitDeviceInfos(&alsaHostApi->baseHostApiRep, hostApiIndex, scanResults, deviceCount);

    PaUtil_InitializeStreamInterface( &alsaHostApi->callbackStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable,
                                      PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &alsaHostApi->blockingStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream,
                                      GetStreamReadAvailable,
                                      GetStreamWriteAvailable );

    PA_ENSURE( PaUnixThreading_Initialize() );

    return result;

error:
    if( alsaHostApi )
    {
        if( alsaHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( alsaHostApi->allocations );
            PaUtil_DestroyAllocationGroup( alsaHostApi->allocations );
        }

        PaUtil_FreeMemory( alsaHostApi );
    }

    return result;
}